

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::BinaryWriterSpec::WriteVar(BinaryWriterSpec *this,Var *var)

{
  Stream *this_00;
  string_view s;
  string *psVar1;
  char *pcVar2;
  int in_EDX;
  
  if (var->type_ != Index) {
    psVar1 = Var::name_abi_cxx11_(var);
    s.data_ = (psVar1->_M_dataplus)._M_p;
    s.size_ = psVar1->_M_string_length;
    WriteEscapedString(this,s);
    return;
  }
  this_00 = this->json_stream_;
  pcVar2 = Var::index(var,(char *)var,in_EDX);
  Stream::Writef(this_00,"\"%u\"",(ulong)pcVar2 & 0xffffffff);
  return;
}

Assistant:

void BinaryWriterSpec::WriteVar(const Var& var) {
  if (var.is_index()) {
    json_stream_->Writef("\"%" PRIindex "\"", var.index());
  } else {
    WriteEscapedString(var.name());
  }
}